

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

QList<int> * __thiscall
QToolBarAreaLayoutInfo::gapIndex(QToolBarAreaLayoutInfo *this,QPoint *pos,int *minDistance)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  qsizetype qVar4;
  const_reference pQVar5;
  long lVar6;
  const_reference pQVar7;
  int *piVar8;
  int *in_RCX;
  bool in_DL;
  QList<QToolBarAreaLayoutLine> *in_RSI;
  QList<int> *in_RDI;
  long in_FS_OFFSET;
  int dist;
  int size;
  QToolBarAreaLayoutItem *item;
  int k;
  QToolBarAreaLayoutLine *line;
  int j;
  int p;
  QList<int> *result;
  undefined4 in_stack_ffffffffffffff38;
  parameter_type in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int iVar9;
  Orientation in_stack_ffffffffffffff44;
  QToolBarAreaLayoutLine *in_stack_ffffffffffffff48;
  QPoint *in_stack_ffffffffffffff50;
  QPoint *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int local_5c;
  int local_50;
  int local_1c;
  QPoint local_18;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = QRect::contains((QPoint *)(in_RSI + 1),in_DL);
  if ((uVar3 & 1) == 0) {
    iVar2 = distance((QToolBarAreaLayoutInfo *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     in_stack_ffffffffffffff60);
    if ((-1 < iVar2) && (iVar2 < *in_RCX)) {
      *in_RCX = iVar2;
      (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->d).ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QList<int>::QList((QList<int> *)0x6f1ed6);
      QList<QToolBarAreaLayoutLine>::size(in_RSI);
      QList<int>::operator<<
                ((QList<int> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c);
      QList<int>::operator<<
                ((QList<int> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c);
      goto LAB_006f1f2b;
    }
  }
  else {
    local_18 = QRect::topLeft((QRect *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                             );
    local_10 = ::operator-(in_stack_ffffffffffffff50,(QPoint *)in_stack_ffffffffffffff48);
    iVar2 = pick(in_stack_ffffffffffffff44,
                 (QPoint *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    for (local_50 = 0; qVar4 = QList<QToolBarAreaLayoutLine>::size(in_RSI), local_50 < qVar4;
        local_50 = local_50 + 1) {
      pQVar5 = QList<QToolBarAreaLayoutLine>::at
                         ((QList<QToolBarAreaLayoutLine> *)
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      bVar1 = QToolBarAreaLayoutLine::skip(in_stack_ffffffffffffff48);
      if ((!bVar1) && (uVar3 = QRect::contains((QPoint *)pQVar5,in_DL), (uVar3 & 1) != 0)) {
        local_5c = 0;
        goto LAB_006f1cc5;
      }
    }
  }
  memset(in_RDI,0,0x18);
  QList<int>::QList((QList<int> *)0x6f1f2b);
  goto LAB_006f1f2b;
LAB_006f1cc5:
  lVar6 = (long)local_5c;
  qVar4 = QList<QToolBarAreaLayoutItem>::size(&pQVar5->toolBarItems);
  iVar9 = in_stack_ffffffffffffff40;
  if (qVar4 <= lVar6) goto LAB_006f1de1;
  pQVar7 = QList<QToolBarAreaLayoutItem>::at
                     ((QList<QToolBarAreaLayoutItem> *)
                      CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                      CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  bVar1 = QToolBarAreaLayoutItem::skip((QToolBarAreaLayoutItem *)in_stack_ffffffffffffff48);
  if (!bVar1) {
    in_stack_ffffffffffffff48 = (QToolBarAreaLayoutLine *)&pQVar7->size;
    in_stack_ffffffffffffff44 = (Orientation)in_RSI[1].d.size;
    QToolBarAreaLayoutItem::sizeHint
              ((QToolBarAreaLayoutItem *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    local_1c = pick(in_stack_ffffffffffffff44,
                    (QSize *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    piVar8 = qMin<int>((int *)in_stack_ffffffffffffff48,&local_1c);
    iVar9 = iVar2;
    if (iVar2 <= pQVar7->pos + *piVar8) goto LAB_006f1de1;
  }
  local_5c = local_5c + 1;
  goto LAB_006f1cc5;
LAB_006f1de1:
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<int>::QList((QList<int> *)0x6f1e10);
  QList<int>::operator<<
            ((QList<int> *)CONCAT44(in_stack_ffffffffffffff44,iVar9),in_stack_ffffffffffffff3c);
  QList<int>::operator<<
            ((QList<int> *)CONCAT44(in_stack_ffffffffffffff44,iVar9),in_stack_ffffffffffffff3c);
  *in_RCX = 0;
LAB_006f1f2b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QList<int> QToolBarAreaLayoutInfo::gapIndex(const QPoint &pos, int *minDistance) const
{
    if (rect.contains(pos)) {
        // <pos> is in QToolBarAreaLayout coordinates.
        // <item.pos> is in local dockarea coordinates (see ~20 lines below)
        // Since we're comparing p with item.pos, we put them in the same coordinate system.
        const int p = pick(o, pos - rect.topLeft());

        for (int j = 0; j < lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = lines.at(j);
            if (line.skip())
                continue;
            if (!line.rect.contains(pos))
                continue;

            int k = 0;
            for (; k < line.toolBarItems.size(); ++k) {
                const QToolBarAreaLayoutItem &item = line.toolBarItems.at(k);
                if (item.skip())
                    continue;

                int size = qMin(item.size, pick(o, item.sizeHint()));

                if (p > item.pos + size)
                    continue;
                if (p > item.pos + size/2)
                    ++k;
                break;
            }

            QList<int> result;
            result << j << k;
            *minDistance = 0; //we found a perfect match
            return result;
        }
    } else {
        const int dist = distance(pos);
        //it will only return a path if the minDistance is higher than the current distance
        if (dist >= 0 && *minDistance > dist) {
            *minDistance = dist;

            QList<int> result;
            result << lines.size() << 0;
            return result;
        }
    }

    return QList<int>();
}